

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O1

void libcmepoll_LTX_remove_select(CMtrans_services_conflict svc,select_data_ptr *sdp,int fd)

{
  FunctionListElement *pFVar1;
  FunctionListElement *pFVar2;
  int iVar3;
  select_data_ptr sd;
  int __op;
  epoll_event ep_event;
  epoll_event local_28;
  
  sd = *sdp;
  local_28.data.fd = 0;
  local_28.events = 0;
  local_28._4_4_ = 0;
  if (sd == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager)0x0);
    sd = *sdp;
  }
  sd->select_consistency_number = sd->select_consistency_number + 1;
  if (sd->write_items[fd].func == (select_list_func)0x0) {
    iVar3 = sd->epfd;
    __op = 2;
  }
  else {
    local_28._4_4_ = fd;
    local_28.events = 4;
    iVar3 = sd->epfd;
    __op = 3;
  }
  iVar3 = epoll_ctl(iVar3,__op,fd,&local_28);
  if (iVar3 < 0) {
    libcmepoll_LTX_remove_select_cold_1();
  }
  pFVar2 = sd->select_items;
  pFVar1 = pFVar2 + fd;
  pFVar1->func = (select_list_func)0x0;
  pFVar1->arg1 = (void *)0x0;
  pFVar2[fd].arg2 = (void *)0x0;
  wake_server_thread(sd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_remove_select(CMtrans_services svc, select_data_ptr *sdp, int fd)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);

    struct epoll_event ep_event = {0}; // for a dumb kernel bug that we will never see

    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    if(sd->write_items[fd].func) {
    	/* this fd should stay armed for write */
    	ep_event.data.fd = fd;
    	ep_event.events = EPOLLOUT;
    	if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
    	}
    } else {
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_DEL, fd, &ep_event) < 0) {
    		fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
        }
    }

    sd->select_items[fd].func = NULL;
    sd->select_items[fd].arg1 = NULL;
    sd->select_items[fd].arg2 = NULL;
    wake_server_thread(sd);
}